

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::GlobalValueChangeFunc::~GlobalValueChangeFunc(GlobalValueChangeFunc *this)

{
  SystemSubroutine::~SystemSubroutine(&this->super_SystemSubroutine);
  operator_delete(this,0x40);
  return;
}

Assistant:

GlobalValueChangeFunc(KnownSystemName knownNameId, bool isFuture) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), isFuture(isFuture) {}